

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTruth.c
# Opt level: O0

void If_CutRotatePins(If_Man_t *p,If_Cut_t *pCut)

{
  uint uVar1;
  word *pwVar2;
  int iVar3;
  int iVar4;
  If_Cut_t *pIVar5;
  int *piVar6;
  word *pIn;
  bool bVar7;
  int local_ac;
  int truthId;
  int i;
  float PinDelays [32];
  If_Obj_t *local_20;
  If_Obj_t *pLeaf;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  if (p->pPars->fUseTtPerm != 0) {
    __assert_fail("!p->pPars->fUseTtPerm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTruth.c"
                  ,0x48,"void If_CutRotatePins(If_Man_t *, If_Cut_t *)");
  }
  local_ac = 0;
  while( true ) {
    bVar7 = false;
    if (local_ac < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
      local_20 = If_ManObj(p,(int)(&pCut[1].Area)[local_ac]);
      bVar7 = local_20 != (If_Obj_t *)0x0;
    }
    if (!bVar7) break;
    pIVar5 = If_ObjCutBest(local_20);
    (&truthId)[local_ac] = (int)pIVar5->Delay;
    local_ac = local_ac + 1;
  }
  if (p->vTtMem[*(uint *)&pCut->field_0x1c >> 0x18] == (Vec_Mem_t *)0x0) {
    iVar3 = If_CutLeaveNum(pCut);
    uVar1 = *(uint *)&pCut->field_0x1c;
    iVar4 = p->nTruth6Words[*(uint *)&pCut->field_0x1c >> 0x18];
    piVar6 = If_CutLeaves(pCut);
    If_CutTruthPermute((word *)0x0,iVar3,uVar1 >> 0x18,iVar4,(float *)&truthId,piVar6);
  }
  else {
    pwVar2 = p->puTempW;
    pIn = If_CutTruthWR(p,pCut);
    Abc_TtCopy(pwVar2,pIn,p->nTruth6Words[*(uint *)&pCut->field_0x1c >> 0x18],0);
    pwVar2 = p->puTempW;
    iVar3 = If_CutLeaveNum(pCut);
    uVar1 = *(uint *)&pCut->field_0x1c;
    iVar4 = p->nTruth6Words[*(uint *)&pCut->field_0x1c >> 0x18];
    piVar6 = If_CutLeaves(pCut);
    If_CutTruthPermute(pwVar2,iVar3,uVar1 >> 0x18,iVar4,(float *)&truthId,piVar6);
    iVar4 = Vec_MemHashInsert(p->vTtMem[*(uint *)&pCut->field_0x1c >> 0x18],p->puTempW);
    iVar3 = If_CutTruthIsCompl(pCut);
    iVar4 = Abc_Var2Lit(iVar4,iVar3);
    pCut->iCutFunc = iVar4;
    if ((*p->puTempW & 1) != 0) {
      __assert_fail("(p->puTempW[0] & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifTruth.c"
                    ,0x54,"void If_CutRotatePins(If_Man_t *, If_Cut_t *)");
    }
  }
  return;
}

Assistant:

void If_CutRotatePins( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    float PinDelays[IF_MAX_LUTSIZE];
    int i, truthId;
    assert( !p->pPars->fUseTtPerm );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
        PinDelays[i] = If_ObjCutBest(pLeaf)->Delay;
    if ( p->vTtMem[pCut->nLeaves] == NULL )
    {
        If_CutTruthPermute( NULL, If_CutLeaveNum(pCut), pCut->nLeaves, p->nTruth6Words[pCut->nLeaves], PinDelays, If_CutLeaves(pCut) );
        return;
    }
    Abc_TtCopy( p->puTempW, If_CutTruthWR(p, pCut), p->nTruth6Words[pCut->nLeaves], 0 );
    If_CutTruthPermute( p->puTempW, If_CutLeaveNum(pCut), pCut->nLeaves, p->nTruth6Words[pCut->nLeaves], PinDelays, If_CutLeaves(pCut) );
    truthId        = Vec_MemHashInsert( p->vTtMem[pCut->nLeaves], p->puTempW );
    pCut->iCutFunc = Abc_Var2Lit( truthId, If_CutTruthIsCompl(pCut) );
    assert( (p->puTempW[0] & 1) == 0 );
}